

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O0

void RadianceTexture(void)

{
  Vector *w;
  Vector *w_00;
  double dVar1;
  Vector radiance;
  Ray ray;
  int in_stack_00000088;
  int in_stack_0000008c;
  Random *in_stack_00000090;
  Ray *in_stack_00000098;
  vector<Sphere,_std::allocator<Sphere>_> *in_stack_000000a0;
  Vector d;
  float dy;
  float dx;
  int i;
  int x;
  Random rng;
  int y;
  uint in_stack_fffffffffffffedc;
  Random *in_stack_fffffffffffffee0;
  Vector local_108;
  Vector local_f0;
  Ray local_d8 [3];
  Vector local_48;
  float local_30;
  float local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  for (local_4 = 0; local_4 < height; local_4 = local_4 + 1) {
    w = (Vector *)(long)local_4;
    w_00 = (Vector *)(long)height;
    clock();
    Random::Random(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    for (local_24 = 0; local_24 < width; local_24 = local_24 + 1) {
      local_28 = ((width - local_24) + -1) * height + local_4;
      dVar1 = Random::operator()((Random *)0x133ed6);
      local_2c = (float)dVar1;
      dVar1 = Random::operator()((Random *)0x133ef0);
      local_30 = (float)dVar1;
      operator*(w,(double)w_00);
      operator*(w,(double)w_00);
      operator+(w,w_00);
      operator+(w,w_00);
      Vector::Normalize(w);
      Ray::Ray(local_d8,&cam.o,&local_48);
      Radiance(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008c,
               in_stack_00000088);
      in_stack_fffffffffffffee0 = (Random *)(double)((float)nPasses * bcg_img[local_28]);
      Vector::Vector(&local_108,1.0,1.0,1.0);
      dVar1 = Vector::Dot(&local_f0,&local_108);
      bcg_img[local_28] =
           (float)(((double)in_stack_fffffffffffffee0 + dVar1 / 3.0) / (double)(nPasses + 1));
    }
  }
  nPasses = nPasses + 1;
  return;
}

Assistant:

void RadianceTexture() {

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      Random rng(y + height*clock());

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/float(width)  - .5) +
                    cy*((dy + y)/float(height) - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         Vector radiance = Radiance(spheres, ray, rng, 0, 1);

         bcg_img[i] = (float(nPasses)*bcg_img[i] + Vector::Dot(radiance, Vector(1,1,1))/3.0f) / float(nPasses+1);
      }
   }

   ++nPasses;
}